

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O0

void QUnifiedTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QUnifiedTimer *in_RDI;
  QUnifiedTimer *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      startTimers(in_RDI);
    }
    else if (in_EDX == 1) {
      stopTimer(in_RDI);
    }
  }
  return;
}

Assistant:

void QUnifiedTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUnifiedTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startTimers(); break;
        case 1: _t->stopTimer(); break;
        default: ;
        }
    }
    (void)_a;
}